

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_contains_range_closed
                (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  void **ppvVar4;
  uint8_t *puVar5;
  bool bVar6;
  _Bool _Var7;
  ushort uVar8;
  int *piVar9;
  uint8_t uVar10;
  int iVar11;
  uint32_t range_end_00;
  uint uVar12;
  int iVar13;
  uint unaff_R14D;
  uint uVar14;
  uint uVar15;
  ulong unaff_R15;
  uint7 uVar17;
  ulong uVar16;
  bool bVar18;
  
  if (range_end < range_start) {
    return true;
  }
  if (range_start == range_end) {
    _Var7 = roaring_bitmap_contains(r,range_start);
    return _Var7;
  }
  iVar11 = (range_end >> 0x10) - (range_start >> 0x10);
  iVar2 = (r->high_low_container).size;
  if (iVar2 <= iVar11) {
    return false;
  }
  if (iVar2 == 0) {
LAB_0011d422:
    uVar14 = iVar2 - 1;
  }
  else {
    puVar3 = (r->high_low_container).keys;
    uVar8 = (ushort)(range_start >> 0x10);
    if (puVar3[(long)iVar2 + -1] == uVar8) goto LAB_0011d422;
    iVar13 = iVar2 + -1;
    uVar15 = 0;
    do {
      if (iVar13 < (int)uVar15) {
        uVar14 = ~uVar15;
        break;
      }
      uVar14 = uVar15 + iVar13 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar15 + iVar13 & 0xfffffffe));
      uVar17 = (uint7)(byte)(uVar1 >> 8);
      if (uVar1 < uVar8) {
        uVar15 = uVar14 + 1;
        unaff_R15 = CONCAT71(uVar17,1);
        uVar14 = unaff_R14D;
      }
      else if (uVar8 < uVar1) {
        iVar13 = uVar14 - 1;
        unaff_R15 = CONCAT71(uVar17,1);
        uVar14 = unaff_R14D;
      }
      else {
        unaff_R15 = 0;
      }
      unaff_R14D = uVar14;
    } while ((char)unaff_R15 != '\0');
  }
  if (iVar2 != 0) {
    puVar3 = (r->high_low_container).keys;
    uVar8 = (ushort)(range_end >> 0x10);
    if (puVar3[(long)iVar2 + -1] != uVar8) {
      iVar13 = iVar2 + -1;
      uVar12 = 0;
      do {
        if (iVar13 < (int)uVar12) {
          uVar15 = ~uVar12;
          break;
        }
        uVar15 = uVar12 + iVar13 >> 1;
        uVar16 = (ulong)uVar15;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar12 + iVar13 & 0xfffffffe));
        if (uVar1 < uVar8) {
          uVar12 = uVar15 + 1;
          bVar6 = true;
          uVar16 = unaff_R15;
        }
        else if (uVar8 < uVar1) {
          iVar13 = uVar15 - 1;
          bVar6 = true;
          uVar16 = unaff_R15;
        }
        else {
          bVar6 = false;
        }
        uVar15 = (uint)uVar16;
        unaff_R15 = uVar16;
      } while (bVar6);
      goto LAB_0011d43f;
    }
  }
  uVar15 = iVar2 - 1;
LAB_0011d43f:
  if (iVar2 <= (int)uVar15) {
    return false;
  }
  if ((int)uVar15 < 0) {
    return false;
  }
  if ((int)uVar14 < 0) {
    return false;
  }
  if (uVar15 - uVar14 == iVar11) {
    range_end_00 = (range_end & 0xffff) + 1;
    ppvVar4 = (r->high_low_container).containers;
    puVar5 = (r->high_low_container).typecodes;
    if (range_end >> 0x10 == range_start >> 0x10) {
      _Var7 = container_contains_range
                        (ppvVar4[uVar14 & 0xffff],range_start & 0xffff,range_end_00,
                         puVar5[uVar14 & 0xffff]);
      return _Var7;
    }
    _Var7 = container_contains_range
                      (ppvVar4[uVar14 & 0xffff],range_start & 0xffff,0x10000,puVar5[uVar14 & 0xffff]
                      );
    if (!_Var7) {
      return false;
    }
    _Var7 = container_contains_range
                      (ppvVar4[uVar15 & 0xffff],0,range_end_00,puVar5[uVar15 & 0xffff]);
    if (!_Var7) {
      return false;
    }
    do {
      uVar14 = uVar14 + 1;
      bVar6 = (int)uVar15 <= (int)uVar14;
      if ((int)uVar15 <= (int)uVar14) {
        return bVar6;
      }
      uVar10 = puVar5[uVar14 & 0xffff];
      piVar9 = (int *)ppvVar4[uVar14 & 0xffff];
      if (uVar10 == '\x04') {
        uVar10 = (uint8_t)piVar9[2];
        piVar9 = *(int **)piVar9;
      }
      if (uVar10 == '\x03') {
        if (*piVar9 != 1) {
          return bVar6;
        }
        if (**(short **)(piVar9 + 2) != 0) {
          return bVar6;
        }
        bVar18 = (*(short **)(piVar9 + 2))[1] == -1;
      }
      else {
        bVar18 = *piVar9 == 0x10000;
      }
      if (!bVar18) {
        return bVar6;
      }
    } while( true );
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_range_closed(const roaring_bitmap_t *r,
                                          uint32_t range_start,
                                          uint32_t range_end) {
    if (range_start > range_end) {
        return true;
    }  // empty range are always contained!
    if (range_end == range_start) {
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    }
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)(range_end >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = (range_end & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}